

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O1

econf_err find_key(econf_file key_file,char *group,char *key,size_t *num)

{
  int iVar1;
  econf_err eVar2;
  char *__s2;
  char **ppcVar3;
  size_t sVar4;
  
  if ((group == (char *)0x0) || (*group == '\0')) {
    group = "_none_";
  }
  __s2 = strdup(group);
  if (__s2 == (char *)0x0) {
    eVar2 = ECONF_NOMEM;
  }
  else if ((key == (char *)0x0) || (*key == '\0')) {
    free(__s2);
    eVar2 = ECONF_ERROR;
  }
  else {
    if (key_file.length != 0) {
      ppcVar3 = &(key_file.file_entry)->key;
      sVar4 = 0;
      do {
        iVar1 = strcmp(((file_entry *)(ppcVar3 + -1))->group,__s2);
        if ((iVar1 == 0) && (iVar1 = strcmp(*ppcVar3,key), iVar1 == 0)) {
          free(__s2);
          *num = sVar4;
          return ECONF_SUCCESS;
        }
        sVar4 = sVar4 + 1;
        ppcVar3 = ppcVar3 + 7;
      } while (key_file.length != sVar4);
    }
    free(__s2);
    eVar2 = ECONF_NOKEY;
  }
  return eVar2;
}

Assistant:

econf_err find_key(econf_file key_file, const char *group, const char *key, size_t *num) {
	char *grp = (!group || !*group) ? strdup(KEY_FILE_NULL_VALUE) : strdup(group);
  if (grp == NULL)
    return  ECONF_NOMEM;
  if (!key || !*key) {
    free(grp);
    return ECONF_ERROR;
  }
  for (size_t i = 0; i < key_file.length; i++) {
    if (!strcmp(key_file.file_entry[i].group, grp) &&
        !strcmp(key_file.file_entry[i].key, key)) {
      free(grp);
      *num = i;
      return ECONF_SUCCESS;
    }
  }
  // Key not found
  free(grp);
  return ECONF_NOKEY;
}